

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeGeneratorFunctionConstructor
               (DynamicObject *generatorFunctionConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  Var value;
  DynamicObject **ppDVar1;
  JavascriptString *value_00;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *generatorFunctionConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,generatorFunctionConstructor,mode,3,0);
  this = RecyclableObject::GetLibrary(&generatorFunctionConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this,generatorFunctionConstructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).generatorFunctionPrototype);
  AddMember(this,generatorFunctionConstructor,0x124,*ppDVar1,'\0');
  value_00 = CreateStringFromCppLiteral<18ul>(this,(char16 (*) [18])0x192e6ca);
  AddMember(this,generatorFunctionConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(generatorFunctionConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorFunctionConstructor(DynamicObject* generatorFunctionConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(generatorFunctionConstructor, mode, 3);
        JavascriptLibrary* library = generatorFunctionConstructor->GetLibrary();

        library->AddMember(generatorFunctionConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(generatorFunctionConstructor, PropertyIds::prototype, library->generatorFunctionPrototype, PropertyNone);
        library->AddMember(generatorFunctionConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("GeneratorFunction")), PropertyConfigurable);

        generatorFunctionConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }